

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O0

shared_ptr<const_nigel::Token_Identifier> __thiscall
nigel::Token::as<nigel::Token_Identifier>(Token *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_nigel::Token_Identifier> sVar1;
  enable_shared_from_this<nigel::Token> local_28;
  Token *this_local;
  
  this_local = this;
  std::enable_shared_from_this<nigel::Token>::shared_from_this(&local_28);
  std::static_pointer_cast<nigel::Token_Identifier_const,nigel::Token_const>
            ((shared_ptr<const_nigel::Token> *)this);
  std::shared_ptr<const_nigel::Token>::~shared_ptr((shared_ptr<const_nigel::Token> *)&local_28);
  sVar1.super___shared_ptr<const_nigel::Token_Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_nigel::Token_Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_nigel::Token_Identifier>)
         sVar1.super___shared_ptr<const_nigel::Token_Identifier,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const T> as() const
		{
			return std::static_pointer_cast< const T >( shared_from_this() );
		}